

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall CompilerContext::compile_repeat(CompilerContext *this,SyntaxTree *repeat_node)

{
  _Rb_tree_header *p_Var1;
  vector<CompiledData,_std::allocator<CompiledData>_> *this_00;
  pointer psVar2;
  SyntaxTree *arg_node;
  SyntaxTree *arg_node_00;
  Command *pCVar3;
  RepeatAnnotation *pRVar4;
  long lVar5;
  LoopInfo *__p;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_00;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_01;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l_02;
  shared_ptr<Label> loop_ptr;
  shared_ptr<Label> break_ptr;
  shared_ptr<Label> continue_ptr;
  allocator_type local_169;
  undefined1 local_168 [24];
  Commands *local_150;
  undefined1 local_148 [24];
  Commands *local_130;
  shared_ptr<Label> local_128;
  shared_ptr<Label> local_118;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_108;
  pointer local_d8;
  ArgVariant local_d0;
  new_allocator<CompilerContext::LoopInfo> *local_98;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_90;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_78;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_60;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  pRVar4 = SyntaxTree::annotation<RepeatAnnotation_const&>(repeat_node);
  psVar2 = (repeat_node->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  arg_node = (psVar2->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  arg_node_00 = psVar2[1].super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  make_internal_label((CompilerContext *)local_148);
  make_internal_label((CompilerContext *)(local_168 + 0x10));
  make_internal_label((CompilerContext *)local_168);
  local_108._0_8_ = local_148._0_8_;
  local_108._8_8_ = local_148._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
    }
  }
  local_98 = (new_allocator<CompilerContext::LoopInfo> *)&this->loop_stack;
  local_108._16_8_ = local_168._16_8_;
  local_108._24_8_ = local_150;
  if (local_150 != (Commands *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_150->commands)._M_t._M_impl.super__Rb_tree_header;
      (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
      UNLOCK();
    }
    else {
      p_Var1 = &(local_150->commands)._M_t._M_impl.super__Rb_tree_header;
      (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
    }
  }
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>
            ((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
             local_98,(LoopInfo *)&local_108._tail);
  if ((Commands *)local_108._24_8_ != (Commands *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  pCVar3 = pRVar4->set_var_to_zero;
  get_arg((ArgVariant *)&local_108._tail,this,arg_node_00);
  get_arg(&local_d0,this,&pRVar4->number_zero);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_108;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_48,__l,&local_169);
  compile_command(this,pCVar3,&local_48,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_48);
  lVar5 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_108 + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  local_118.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168._0_8_;
  local_118.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi + 1
      ;
      UNLOCK();
    }
    else {
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi + 1
      ;
    }
  }
  this_00 = &this->compiled;
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,&local_118);
  if ((Commands *)local_118.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (Commands *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  compile_statements(this,(repeat_node->childs).
                          super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148._0_8_;
  local_128.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
    }
  }
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,&local_128);
  if ((pointer)local_128.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pCVar3 = pRVar4->add_var_with_one;
  get_arg((ArgVariant *)&local_108._tail,this,arg_node_00);
  get_arg(&local_d0,this,&pRVar4->number_one);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_108;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_60,__l_00,&local_169);
  compile_command(this,pCVar3,&local_60,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_60);
  lVar5 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_108 + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  pCVar3 = pRVar4->is_var_geq_times;
  get_arg((ArgVariant *)&local_108._tail,this,arg_node_00);
  get_arg(&local_d0,this,arg_node);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_108;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_78,__l_01,&local_169);
  compile_command(this,pCVar3,&local_78,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_78);
  lVar5 = 0x38;
  do {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)((long)&local_108 + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  pCVar3 = (this->commands->goto_if_false).ref;
  if (pCVar3 != (Command *)0x0) {
    local_108._0_8_ = local_168._0_8_;
    local_108._8_8_ = local_168._8_8_;
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi +
             1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168._8_8_ + 8))->_M_pi +
             1;
      }
    }
    local_d8 = (pointer)0x6;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_108;
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::vector(&local_90,__l_02,&local_169);
    compile_command(this,pCVar3,&local_90,false);
    std::
    vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
    ::~vector(&local_90);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                *)&local_108._tail);
    local_148._16_8_ = local_168._16_8_;
    local_130 = local_150;
    if (local_150 != (Commands *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_150->commands)._M_t._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
        UNLOCK();
      }
      else {
        p_Var1 = &(local_150->commands)._M_t._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
      }
    }
    std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
              ((vector<CompiledData,std::allocator<CompiledData>> *)this_00,
               (shared_ptr<Label> *)(local_148 + 0x10));
    if (local_130 != (Commands *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130);
    }
    __p = (this->loop_stack).
          super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish + -1;
    (this->loop_stack).
    super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = __p;
    __gnu_cxx::new_allocator<CompilerContext::LoopInfo>::destroy<CompilerContext::LoopInfo>
              (local_98,__p);
    if ((pointer)local_168._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if (local_150 != (Commands *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
    return;
  }
  __assert_fail("!\"ref\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                ,0x2ac,
                "auto std::experimental::optional<const Command &>::operator*()::(anonymous class)::operator()() const [T = const Command &]"
               );
}

Assistant:

void CompilerContext::compile_repeat(const SyntaxTree& repeat_node)
{
    auto& annotation = repeat_node.annotation<const RepeatAnnotation&>();
    auto& times = repeat_node.child(0);
    auto& var = repeat_node.child(1);

    auto continue_ptr = make_internal_label();
    auto break_ptr    = make_internal_label();
    auto loop_ptr     = make_internal_label();

    loop_stack.emplace_back(LoopInfo { continue_ptr, break_ptr });

    compile_command(annotation.set_var_to_zero, { get_arg(var), get_arg(annotation.number_zero) });
    compile_label(loop_ptr);
    compile_statements(repeat_node.child(2));
    compile_label(continue_ptr);
    compile_command(annotation.add_var_with_one, { get_arg(var), get_arg(annotation.number_one) });
    compile_command(annotation.is_var_geq_times, { get_arg(var), get_arg(times) });
    compile_command(*this->commands.goto_if_false, { loop_ptr });
    compile_label(break_ptr);

    loop_stack.pop_back();
}